

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O1

int __thiscall icu_63::UnicodeString::copy(UnicodeString *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  short sVar1;
  int iVar2;
  int extraout_EAX;
  UChar *in_RAX;
  int32_t in_ECX;
  int iVar3;
  int srcLength;
  int iVar4;
  int start;
  
  iVar3 = (int)src;
  iVar4 = (int)dst;
  srcLength = iVar3 - iVar4;
  if ((srcLength != 0 && iVar4 <= iVar3) &&
     (in_RAX = (UChar *)uprv_malloc_63((long)srcLength * 2), in_RAX != (UChar *)0x0)) {
    start = 0;
    if (-1 < iVar4) {
      sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar2 = (this->fUnion).fFields.fLength;
      }
      else {
        iVar2 = (int)sVar1 >> 5;
      }
      start = iVar4;
      if (iVar2 < iVar4) {
        start = iVar2;
      }
    }
    iVar4 = 0;
    if (-1 < iVar3) {
      sVar1 = (this->fUnion).fStackFields.fLengthAndFlags;
      if (sVar1 < 0) {
        iVar2 = (this->fUnion).fFields.fLength;
      }
      else {
        iVar2 = (int)sVar1 >> 5;
      }
      iVar4 = iVar3;
      if (iVar2 < iVar3) {
        iVar4 = iVar2;
      }
    }
    doExtract(this,start,iVar4 - start,in_RAX,0);
    doReplace(this,in_ECX,0,in_RAX,0,srcLength);
    uprv_free_63(in_RAX);
    return extraout_EAX;
  }
  return (int)in_RAX;
}

Assistant:

void 
UnicodeString::copy(int32_t start, int32_t limit, int32_t dest) {
    if (limit <= start) {
        return; // Nothing to do; avoid bogus malloc call
    }
    UChar* text = (UChar*) uprv_malloc( sizeof(UChar) * (limit - start) );
    // Check to make sure text is not null.
    if (text != NULL) {
	    extractBetween(start, limit, text, 0);
	    insert(dest, text, 0, limit - start);    
	    uprv_free(text);
    }
}